

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::cycleMode(XFormWidget *this)

{
  if ((this->poseMode == false) && ((ulong)this->mode < 3)) {
    this->mode = *(Mode *)(&DAT_001efefc + (ulong)this->mode * 4);
  }
  return;
}

Assistant:

void XFormWidget::cycleMode() {
  if (poseMode) return;

  if (mode == Mode::Translate)
    mode = Mode::Rotate;
  else if (mode == Mode::Rotate)
    mode = Mode::Scale;
  else if (mode == Mode::Scale)
    mode = Mode::Translate;
}